

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

uint64_t bitset_set_list_withcard(uint64_t *words,uint64_t card,uint16_t *list,uint64_t length)

{
  ushort *puVar1;
  ushort uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = cpuid_Extended_Feature_Enumeration_info(7);
  if ((*(uint *)(lVar4 + 4) & 0x20) == 0) {
    if (length != 0) {
      lVar4 = 0;
      do {
        uVar2 = *(ushort *)((long)list + lVar4);
        uVar5 = words[uVar2 >> 6] | 1L << ((ulong)uVar2 & 0x3f);
        card = card + ((words[uVar2 >> 6] ^ uVar5) >> ((byte)uVar2 & 0x3f));
        words[uVar2 >> 6] = uVar5;
        lVar4 = lVar4 + 2;
      } while (length * 2 != lVar4);
    }
  }
  else if (length != 0) {
    puVar1 = list + length;
    do {
      uVar2 = *list >> 6;
      uVar5 = words[uVar2];
      uVar3 = (ulong)*list & 0x3f;
      words[uVar2] = uVar5 | 1L << uVar3;
      card = (card + 1) - (ulong)((uVar5 >> uVar3 & 1) != 0);
      list = list + 1;
    } while (puVar1 != list);
  }
  return card;
}

Assistant:

uint64_t bitset_set_list_withcard(uint64_t *words, uint64_t card,
                                  const uint16_t *list, uint64_t length) {
    if( croaring_avx2() ) {
        return _asm_bitset_set_list_withcard(words, card, list, length);
    } else {
        return _scalar_bitset_set_list_withcard(words, card, list, length);
    }
}